

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::BackupWallet(CWallet *this,string *strDest)

{
  long lVar1;
  int iVar2;
  WalletDatabase *pWVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar3 = GetDatabase(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar2 = (*pWVar3->_vptr_WalletDatabase[6])
                      (pWVar3,strDest,*(long *)(in_FS_OFFSET + 0x28),pWVar3->_vptr_WalletDatabase[6]
                      );
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::BackupWallet(const std::string& strDest) const
{
    return GetDatabase().Backup(strDest);
}